

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O3

void testExactL2<makeTests(TasGrid::TypeAcceleration,int)::__16>(TasmanianSparseGrid *grid)

{
  double dVar1;
  pointer pdVar2;
  TasmanianSparseGrid *grid_00;
  pointer pdVar3;
  char cVar4;
  TypeOneDRule TVar5;
  ostream *poVar6;
  runtime_error *this;
  long lVar7;
  BaseCanonicalGrid *pBVar8;
  size_type __n;
  BaseCanonicalGrid *pBVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  TasmanianSparseGrid ref_grid;
  allocator_type local_15a;
  allocator_type local_159;
  vector<double,_std::allocator<double>_> local_158;
  long local_140;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  TasmanianSparseGrid *local_100;
  vector<double,_std::allocator<double>_> local_f8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  TasmanianSparseGrid local_b0;
  
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbfe0000000000000;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbfe0000000000000;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_138;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b0,__l,&local_15a);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe6666666666666;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe6666666666666;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_158,__l_00,&local_159);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_b0);
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.acceleration._M_t.
      super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
      .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
       )0x0) {
    operator_delete((void *)local_b0.acceleration._M_t.
                            super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                            .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>.
                            _M_head_impl,
                    (long)local_b0.domain_transform_a.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_b0.acceleration._M_t.
                          super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                          .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl
                   );
  }
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&local_b0,grid);
  pBVar9 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar9 == (BaseCanonicalGrid *)0x0) {
    lVar13 = 0;
    lVar10 = 0;
    uVar11 = 0;
  }
  else {
    lVar10 = (long)*(int *)(pBVar9 + 0x10);
    lVar13 = (long)*(int *)(pBVar9 + 0x14);
    pBVar8 = pBVar9 + 0x20;
    if (*(long *)(pBVar9 + 0x28) == *(long *)(pBVar9 + 0x30)) {
      pBVar8 = pBVar9 + 0x48;
    }
    uVar11 = (ulong)*(uint *)pBVar8;
  }
  TasGrid::TasmanianSparseGrid::getPoints(&local_158,grid);
  pBVar9 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar9 == (BaseCanonicalGrid *)0x0) {
    __n = 0;
  }
  else {
    pBVar8 = pBVar9 + 0x20;
    if (*(long *)(pBVar9 + 0x28) == *(long *)(pBVar9 + 0x30)) {
      pBVar8 = pBVar9 + 0x48;
    }
    __n = (long)*(int *)pBVar8 * (long)*(int *)(pBVar9 + 0x14);
  }
  local_100 = grid;
  std::vector<double,_std::allocator<double>_>::vector(&local_f8,__n,&local_15a);
  local_140 = lVar13;
  if (0 < (int)uVar11) {
    local_140 = lVar13 << 3;
    lVar12 = 0x10;
    lVar13 = 0x10;
    do {
      pdVar3 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *(double *)
               ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar12 + -8) + -0.3;
      dVar1 = exp((*(double *)
                    ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12) + 0.4) *
                  -(*(double *)
                     ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar12 + -0x10) + -0.1) * dVar1 *
                  dVar1);
      *(double *)((long)pdVar3 + lVar13 + -0x10) = dVar1;
      dVar1 = exp((*(double *)((long)pdVar2 + lVar12) + 0.3) *
                  (*(double *)((long)pdVar2 + lVar12 + -8) + -0.2) *
                  -(*(double *)((long)pdVar2 + lVar12 + -0x10) + -0.1));
      *(double *)((long)pdVar3 + lVar13 + -8) = dVar1;
      dVar1 = exp((*(double *)((long)pdVar2 + lVar12) + -0.1) *
                  (*(double *)((long)pdVar2 + lVar12 + -8) + 0.1) *
                  -(*(double *)((long)pdVar2 + lVar12 + -0x10) + 0.3));
      *(double *)((long)pdVar3 + lVar13) = dVar1;
      lVar13 = lVar13 + local_140;
      lVar12 = lVar12 + lVar10 * 8;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_manager;
  TasGrid::loadNeededPoints<true,false>
            ((function<void_(const_double_*,_double_*,_unsigned_long)> *)&local_d8,&local_b0,1);
  grid_00 = local_100;
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if (cVar4 == '\0') {
    uVar14 = 0;
    uVar15 = 0;
  }
  else {
    uVar14 = 0xd2f1a9fc;
    uVar15 = 0x3f50624d;
  }
  TasGrid::loadUnstructuredDataL2(&local_138,&local_120,(double)CONCAT44(uVar15,uVar14),grid_00);
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if (cVar4 == '\0') {
    if (local_b0.base._M_t.
        super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        ._M_t.
        super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
         )0x0) {
      lVar10 = 0;
    }
    else {
      pBVar9 = (BaseCanonicalGrid *)
               ((long)local_b0.base._M_t.
                      super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                      .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
               0x20);
      if (*(long *)((long)local_b0.base._M_t.
                          super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                   0x28) ==
          *(long *)((long)local_b0.base._M_t.
                          super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                   0x30)) {
        pBVar9 = (BaseCanonicalGrid *)
                 ((long)local_b0.base._M_t.
                        super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                        .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                 0x48);
      }
      lVar10 = (long)*(int *)pBVar9 *
               (long)*(int *)((long)local_b0.base._M_t.
                                    super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                                    .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>.
                                    _M_head_impl + 0x14);
    }
    lVar13 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
    lVar12 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
    if (lVar10 != 0) {
      dVar1 = 0.0;
      lVar7 = 0;
      do {
        dVar16 = ABS(*(double *)(lVar13 + lVar7 * 8) - *(double *)(lVar12 + lVar7 * 8));
        if (dVar1 <= dVar16) {
          dVar1 = dVar16;
        }
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
      if (1e-12 < dVar1) goto LAB_0010c1da;
    }
  }
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if (cVar4 != '\0') {
    dVar1 = evalDifference(&local_138,&local_b0,grid_00);
    if (0.01 < dVar1) {
LAB_0010c1da:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed exact unstructured construction\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Observed coefficients error: ",0x1d);
      dVar1 = coefficientDifference(&local_b0,grid_00);
      poVar6 = std::ostream::_M_insert<double>(dVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Observed evaluate error: ",0x19);
      dVar1 = evalDifference(&local_138,&local_b0,grid_00);
      poVar6 = std::ostream::_M_insert<double>(dVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      TasGrid::TasmanianSparseGrid::printStats((ostream *)grid_00);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"test failed");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&local_b0);
  return;
}

Assistant:

void testExactL2(TasmanianSparseGrid &&grid, CallableModel model){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});
    auto ref_grid = grid;

    auto data = generateExactData(grid, model);

    loadNeededPoints(model, ref_grid, 1);
    if (OneDimensionalMeta::isNonNested(grid.getRule()))
        loadUnstructuredDataL2(data.first, data.second, 1.E-3, grid);
    else
        loadUnstructuredDataL2(data.first, data.second, 0.0, grid);

    if ((not OneDimensionalMeta::isNonNested(grid.getRule()) and coefficientDifference(ref_grid, grid) > Maths::num_tol)
        or (OneDimensionalMeta::isNonNested(grid.getRule()) and evalDifference(data.first, ref_grid, grid) > 1.E-2))
    {
        cout << "Failed exact unstructured construction\n";
        cout << "Observed coefficients error: " << coefficientDifference(ref_grid, grid) << "\n";
        cout << "Observed evaluate error: " << evalDifference(data.first, ref_grid, grid) << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}